

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O2

void cl_send_cb(uv_udp_send_t *req,int status)

{
  char *__format;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  if (req == (uv_udp_send_t *)0x0) {
    pcVar2 = "!=";
    eval_a = 0;
    pcVar3 = "NULL";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar1 = "req";
    uVar4 = 0x3b;
  }
  else {
    eval_a = (int64_t)status;
    if (eval_a == 0) {
      if (req->handle == &client || req->handle == &server) {
        cl_send_cb_called = cl_send_cb_called + 1;
        return;
      }
      pcVar2 = "!=";
      pcVar1 = "(uv_udp_t*)(req->handle) == &server || (uv_udp_t*)(req->handle) == &client";
      uVar4 = 0x3d;
      eval_a = 0;
    }
    else {
      pcVar2 = "==";
      pcVar1 = "status";
      uVar4 = 0x3c;
    }
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar3 = "0";
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-immediate.c"
          ,uVar4,pcVar1,pcVar2,pcVar3,eval_a,pcVar2,0);
  abort();
}

Assistant:

static void cl_send_cb(uv_udp_send_t* req, int status) {
  int r;

  ASSERT_NOT_NULL(req);
  ASSERT_OK(status);
  CHECK_HANDLE(req->handle);

  r = uv_udp_recv_start(req->handle, cl_alloc_cb, cl_recv_cb);
  ASSERT_OK(r);

  cl_send_cb_called++;
}